

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

bool __thiscall
v_array<node_pred>::contain_sorted(v_array<node_pred> *this,node_pred *ele,size_t *index)

{
  size_t sVar1;
  bool bVar2;
  
  sVar1 = find_sorted(this,ele);
  *index = sVar1;
  if (sVar1 == ((long)this->_end - (long)this->_begin) / 0x18) {
    bVar2 = false;
  }
  else {
    bVar2 = this->_begin[sVar1].label == ele->label;
  }
  return bVar2;
}

Assistant:

bool contain_sorted(const T& ele, size_t& index)
  {
    index = find_sorted(ele);

    if (index == this->size())
      return false;

    if (_begin[index] == ele)
      return true;

    return false;
  }